

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

bool __thiscall PrintableString::SetValue(PrintableString *this,char *str)

{
  char *pcVar1;
  int iVar2;
  char *tmp;
  byte bVar3;
  byte *pbVar4;
  
  if (str == (char *)0x0) {
    return false;
  }
  bVar3 = *str;
  if (bVar3 != 0) {
    pbVar4 = (byte *)(str + 1);
    do {
      iVar2 = isalnum((int)(char)bVar3);
      if ((iVar2 == 0) &&
         ((0x3f < bVar3 || ((0xa400fb8100000000U >> ((ulong)bVar3 & 0x3f) & 1) == 0)))) {
        return false;
      }
      bVar3 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar3 != 0);
  }
  pcVar1 = (char *)(this->value)._M_string_length;
  strlen(str);
  std::__cxx11::string::_M_replace((ulong)&this->value,0,pcVar1,(ulong)str);
  return true;
}

Assistant:

bool PrintableString::SetValue(const char * str)
{
	const char* tmp = str;
	if (str == nullptr)
		return false;

	for (; *tmp != '\0'; ++tmp)
	{
		if (!isalnum(*tmp))
		{
			switch (*tmp)
			{
			case ' ':
			case '\'':
			case '(':
			case ')':
			case '+':
			case ',':
			case '-':
			case '.':
			case '/':
			case ':':
			case '=':
			case '?':
				break;
			default:
				return false;
			}
		}
	}

	value = str;
	return true;
}